

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O0

void rgb_ycc_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                    JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  _func_void_j_compress_ptr *p_Var2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  JSAMPIMAGE pppJVar9;
  uint local_6c;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW outptr2;
  JSAMPROW outptr1;
  JSAMPROW outptr0;
  JSAMPROW inptr;
  INT32 *ctab;
  int b;
  int g;
  int r;
  my_cconvert_ptr_conflict cconvert;
  int num_rows_local;
  JDIMENSION output_row_local;
  JSAMPIMAGE output_buf_local;
  JSAMPARRAY input_buf_local;
  j_compress_ptr cinfo_local;
  
  p_Var2 = cinfo->cconvert[1].start_pass;
  uVar1 = cinfo->image_width;
  cconvert._0_4_ = num_rows;
  cconvert._4_4_ = output_row;
  output_buf_local = (JSAMPIMAGE)input_buf;
  while (cconvert._0_4_ = (int)cconvert + -1, -1 < (int)cconvert) {
    pppJVar9 = output_buf_local + 1;
    outptr0 = (JSAMPROW)*output_buf_local;
    pJVar3 = (*output_buf)[cconvert._4_4_];
    pJVar4 = output_buf[1][cconvert._4_4_];
    pJVar5 = output_buf[2][cconvert._4_4_];
    cconvert._4_4_ = cconvert._4_4_ + 1;
    for (local_6c = 0; output_buf_local = pppJVar9, local_6c < uVar1; local_6c = local_6c + 1) {
      uVar6 = (uint)*outptr0;
      uVar7 = (uint)outptr0[1];
      uVar8 = (uint)outptr0[2];
      outptr0 = outptr0 + 3;
      pJVar3[local_6c] =
           (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)uVar6 * 8) +
                             *(long *)(p_Var2 + (long)(int)(uVar7 + 0x100) * 8) +
                            *(long *)(p_Var2 + (long)(int)(uVar8 + 0x200) * 8)) >> 0x10);
      pJVar4[local_6c] =
           (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x300) * 8) +
                             *(long *)(p_Var2 + (long)(int)(uVar7 + 0x400) * 8) +
                            *(long *)(p_Var2 + (long)(int)(uVar8 + 0x500) * 8)) >> 0x10);
      pJVar5[local_6c] =
           (JSAMPLE)((ulong)(*(long *)(p_Var2 + (long)(int)(uVar6 + 0x500) * 8) +
                             *(long *)(p_Var2 + (long)(int)(uVar7 + 0x600) * 8) +
                            *(long *)(p_Var2 + (long)(int)(uVar8 + 0x700) * 8)) >> 0x10);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_ycc_convert (j_compress_ptr cinfo,
		 JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
		 JDIMENSION output_row, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  register int r, g, b;
  register INT32 * ctab = cconvert->rgb_ycc_tab;
  register JSAMPROW inptr;
  register JSAMPROW outptr0, outptr1, outptr2;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->image_width;

  while (--num_rows >= 0) {
    inptr = *input_buf++;
    outptr0 = output_buf[0][output_row];
    outptr1 = output_buf[1][output_row];
    outptr2 = output_buf[2][output_row];
    output_row++;
    for (col = 0; col < num_cols; col++) {
      r = GETJSAMPLE(inptr[RGB_RED]);
      g = GETJSAMPLE(inptr[RGB_GREEN]);
      b = GETJSAMPLE(inptr[RGB_BLUE]);
      inptr += RGB_PIXELSIZE;
      /* If the inputs are 0..MAXJSAMPLE, the outputs of these equations
       * must be too; we do not need an explicit range-limiting operation.
       * Hence the value being shifted is never negative, and we don't
       * need the general RIGHT_SHIFT macro.
       */
      /* Y */
      outptr0[col] = (JSAMPLE)
		((ctab[r+R_Y_OFF] + ctab[g+G_Y_OFF] + ctab[b+B_Y_OFF])
		 >> SCALEBITS);
      /* Cb */
      outptr1[col] = (JSAMPLE)
		((ctab[r+R_CB_OFF] + ctab[g+G_CB_OFF] + ctab[b+B_CB_OFF])
		 >> SCALEBITS);
      /* Cr */
      outptr2[col] = (JSAMPLE)
		((ctab[r+R_CR_OFF] + ctab[g+G_CR_OFF] + ctab[b+B_CR_OFF])
		 >> SCALEBITS);
    }
  }
}